

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxMorph::Read(PmxMorph *this,istream *stream,PmxSetting *setting)

{
  type pPVar1;
  type pPVar2;
  type pPVar3;
  type pPVar4;
  type pPVar5;
  DeadlyImportError *this_00;
  uint8_t in_CL;
  allocator<char> local_d1;
  string local_d0;
  int local_ac;
  int i_4;
  int local_9c;
  int i_3;
  int local_8c;
  int i_2;
  int local_7c;
  int i_1;
  int local_6c;
  int i;
  string local_60;
  string local_40;
  PmxSetting *local_20;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxMorph *this_local;
  
  local_20 = setting;
  setting_local = (PmxSetting *)stream;
  stream_local = (istream *)this;
  ReadString_abi_cxx11_(&local_40,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ReadString_abi_cxx11_(&local_60,(pmx *)setting_local,(istream *)(ulong)local_20->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->morph_english_name,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::istream::read((char *)setting_local,(long)&this->category);
  std::istream::read((char *)setting_local,(long)&this->morph_type);
  std::istream::read((char *)setting_local,(long)&this->offset_count);
  switch(this->morph_type) {
  case Group:
    mmd::make_unique<pmx::PmxMorphGroupOffset[]>
              ((mmd *)&stack0xffffffffffffff98,(long)this->offset_count);
    std::unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>::
    operator=(&this->group_offsets,
              (unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
               *)&stack0xffffffffffffff98);
    std::unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 *)&stack0xffffffffffffff98);
    for (local_6c = 0; local_6c < this->offset_count; local_6c = local_6c + 1) {
      pPVar1 = std::
               unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
               ::operator[](&this->group_offsets,(long)local_6c);
      (**(pPVar1->super_PmxMorphOffset)._vptr_PmxMorphOffset)(pPVar1,setting_local,local_20);
    }
    break;
  case Vertex:
    mmd::make_unique<pmx::PmxMorphVertexOffset[]>
              ((mmd *)&stack0xffffffffffffff88,(long)this->offset_count);
    std::unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ::operator=(&this->vertex_offsets,
                (unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 *)&stack0xffffffffffffff88);
    std::unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ::~unique_ptr((unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                   *)&stack0xffffffffffffff88);
    for (local_7c = 0; local_7c < this->offset_count; local_7c = local_7c + 1) {
      pPVar2 = std::
               unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
               ::operator[](&this->vertex_offsets,(long)local_7c);
      (**(pPVar2->super_PmxMorphOffset)._vptr_PmxMorphOffset)(pPVar2,setting_local,local_20);
    }
    break;
  case Bone:
    mmd::make_unique<pmx::PmxMorphBoneOffset[]>
              ((mmd *)&stack0xffffffffffffff78,(long)this->offset_count);
    std::unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>::
    operator=(&this->bone_offsets,
              (unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
               *)&stack0xffffffffffffff78);
    std::unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 *)&stack0xffffffffffffff78);
    for (local_8c = 0; local_8c < this->offset_count; local_8c = local_8c + 1) {
      pPVar3 = std::
               unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
               ::operator[](&this->bone_offsets,(long)local_8c);
      (**(pPVar3->super_PmxMorphOffset)._vptr_PmxMorphOffset)(pPVar3,setting_local,local_20);
    }
    break;
  case UV:
  case AdditionalUV1:
  case AdditionalUV2:
  case AdditionalUV3:
  case AdditionalUV4:
    mmd::make_unique<pmx::PmxMorphUVOffset[]>
              ((mmd *)&stack0xffffffffffffff58,(long)this->offset_count);
    std::unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
    operator=(&this->uv_offsets,
              (unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_> *)
              &stack0xffffffffffffff58);
    std::unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 *)&stack0xffffffffffffff58);
    for (local_ac = 0; local_ac < this->offset_count; local_ac = local_ac + 1) {
      pPVar5 = std::
               unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
               operator[](&this->uv_offsets,(long)local_ac);
      (**(pPVar5->super_PmxMorphOffset)._vptr_PmxMorphOffset)(pPVar5,setting_local,local_20);
    }
    break;
  case Matrial:
    mmd::make_unique<pmx::PmxMorphMaterialOffset[]>
              ((mmd *)&stack0xffffffffffffff68,(long)this->offset_count);
    std::
    unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>::
    operator=(&this->material_offsets,
              (unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
               *)&stack0xffffffffffffff68);
    std::
    unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 *)&stack0xffffffffffffff68);
    for (local_9c = 0; local_9c < this->offset_count; local_9c = local_9c + 1) {
      pPVar4 = std::
               unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
               ::operator[](&this->material_offsets,(long)local_9c);
      (**(pPVar4->super_PmxMorphOffset)._vptr_PmxMorphOffset)(pPVar4,setting_local,local_20);
    }
    break;
  default:
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"MMD: unknown morth type",&local_d1);
    DeadlyImportError::DeadlyImportError(this_00,&local_d0);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  return;
}

Assistant:

void PmxMorph::Read(std::istream *stream, PmxSetting *setting)
	{
		this->morph_name = ReadString(stream, setting->encoding);
		this->morph_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &category, sizeof(MorphCategory));
		stream->read((char*) &morph_type, sizeof(MorphType));
		stream->read((char*) &this->offset_count, sizeof(int));
		switch (this->morph_type)
		{
		case MorphType::Group:
			group_offsets = mmd::make_unique<PmxMorphGroupOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				group_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Vertex:
			vertex_offsets = mmd::make_unique<PmxMorphVertexOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				vertex_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Bone:
			bone_offsets = mmd::make_unique<PmxMorphBoneOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				bone_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Matrial:
			material_offsets = mmd::make_unique<PmxMorphMaterialOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				material_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::UV:
		case MorphType::AdditionalUV1:
		case MorphType::AdditionalUV2:
		case MorphType::AdditionalUV3:
		case MorphType::AdditionalUV4:
			uv_offsets = mmd::make_unique<PmxMorphUVOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				uv_offsets[i].Read(stream, setting);
			}
			break;
		default:
            throw DeadlyImportError("MMD: unknown morth type");
		}
	}